

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_xml.c
# Opt level: O0

LY_ERR xml_print_data(ly_out *out,lyd_node *root,uint32_t options)

{
  LY_ERR LVar1;
  ly_ctx *local_78;
  undefined1 auStack_68 [4];
  LY_ERR ret__;
  xmlpr_ctx pctx;
  lyd_node *node;
  uint32_t options_local;
  lyd_node *root_local;
  ly_out *out_local;
  
  memset(auStack_68,0,0x38);
  if (root == (lyd_node *)0x0) {
    if ((out->type == LY_OUT_MEMORY) || (out->type == LY_OUT_CALLBACK)) {
      ly_print_(out,"");
    }
  }
  else {
    pctx.out._0_2_ = 0;
    if (root->schema == (lysc_node *)0x0) {
      local_78 = (ly_ctx *)root[2].schema;
    }
    else {
      local_78 = root->schema->module->ctx;
    }
    pctx._8_8_ = local_78;
    _auStack_68 = out;
    pctx.out._4_4_ = options;
    for (pctx.ns.field_2 = (anon_union_8_3_0df1e6ad_for_ly_set_2)root;
        pctx.ns.field_2.dnodes != (lyd_node **)0x0;
        pctx.ns.field_2 = *(anon_union_8_3_0df1e6ad_for_ly_set_2 *)(pctx.ns.field_2.dnodes + 3)) {
      LVar1 = xml_print_node((xmlpr_ctx *)auStack_68,(lyd_node *)pctx.ns.field_2.dnodes);
      if (LVar1 != LY_SUCCESS) {
        return LVar1;
      }
      if ((options & 1) == 0) break;
    }
  }
  if ((pctx.ctx._4_4_ == 0) && (pctx.prefix.field_2._4_4_ == 0)) {
    ly_set_erase((ly_set *)&pctx.ctx,(_func_void_void_ptr *)0x0);
    ly_set_erase((ly_set *)&pctx.prefix.field_2,(_func_void_void_ptr *)0x0);
    ly_print_flush(out);
    return LY_SUCCESS;
  }
  __assert_fail("!pctx.prefix.count && !pctx.ns.count",
                "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/printer_xml.c"
                ,0x271,"LY_ERR xml_print_data(struct ly_out *, const struct lyd_node *, uint32_t)");
}

Assistant:

LY_ERR
xml_print_data(struct ly_out *out, const struct lyd_node *root, uint32_t options)
{
    const struct lyd_node *node;
    struct xmlpr_ctx pctx = {0};

    if (!root) {
        if ((out->type == LY_OUT_MEMORY) || (out->type == LY_OUT_CALLBACK)) {
            ly_print_(out, "");
        }
        goto finish;
    }

    pctx.out = out;
    pctx.level = 0;
    pctx.options = options;
    pctx.ctx = LYD_CTX(root);

    /* content */
    LY_LIST_FOR(root, node) {
        LY_CHECK_RET(xml_print_node(&pctx, node));
        if (!(options & LYD_PRINT_WITHSIBLINGS)) {
            break;
        }
    }

finish:
    assert(!pctx.prefix.count && !pctx.ns.count);
    ly_set_erase(&pctx.prefix, NULL);
    ly_set_erase(&pctx.ns, NULL);
    ly_print_flush(out);
    return LY_SUCCESS;
}